

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCallRef(TranslateToFuzzReader *this,Type type)

{
  Module *pMVar1;
  pointer puVar2;
  pointer puVar3;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> _Var4;
  uint32_t uVar5;
  Expression *pEVar6;
  Type *pTVar7;
  uintptr_t *puVar8;
  RefFunc *target;
  CallRef *pCVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  size_t extraout_RDX_01;
  long lVar10;
  bool isReturn;
  Type local_80;
  Expression *local_78;
  Random *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  undefined1 local_48 [8];
  Iterator __begin1;
  
  local_70 = &this->random;
  lVar10 = 10;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = type.id;
  do {
    pMVar1 = this->wasm;
    puVar2 = (pMVar1->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (pMVar1->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar2 == puVar3) break;
    uVar5 = Random::upTo(local_70,(uint32_t)((ulong)((long)puVar3 - (long)puVar2) >> 3));
    _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (pMVar1->functions).
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
    if ((__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index == 1) &&
       (((this->wasm->features).features & 0x80) != 0)) {
      ::wasm::HeapType::getSignature();
      ::wasm::HeapType::getSignature();
      isReturn = extraout_RDX == extraout_RDX_00;
    }
    else {
      isReturn = false;
    }
    ::wasm::HeapType::getSignature();
    if ((isReturn != false) ||
       (extraout_RDX_01 ==
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index)) {
      auStack_68 = (undefined1  [8])0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80.id = ::wasm::HeapType::getSignature();
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      local_48 = (undefined1  [8])&local_80;
      pTVar7 = (Type *)::wasm::Type::size();
      if (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
          pTVar7) goto LAB_0013dda2;
      do {
        do {
          puVar8 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_48);
          local_78 = make(this,(Type)*puVar8);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                     &local_78);
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
        } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                 != pTVar7);
LAB_0013dda2:
      } while (local_48 != (undefined1  [8])&local_80);
      target = Builder::makeRefFunc
                         (&this->builder,
                          (Name)*(string_view *)
                                 _Var4.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                          (HeapType)
                          *(uintptr_t *)
                           ((long)_Var4.
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                           0x38));
      pCVar9 = Builder::
               makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                         (&this->builder,(Expression *)target,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_68,
                          (Type)__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index,isReturn);
      if (auStack_68 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_68,
                        (long)args.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
      }
      return (Expression *)pCVar9;
    }
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
  pEVar6 = makeTrivial(this,(Type)__begin1.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeCallRef(Type type) {
  // look for a call target with the right type
  Function* target;
  bool isReturn;
  size_t i = 0;
  while (1) {
    if (i == TRIES || wasm.functions.empty()) {
      // We can't find a proper target, give up.
      return makeTrivial(type);
    }
    // TODO: handle unreachable
    target = wasm.functions[upTo(wasm.functions.size())].get();
    isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
               funcContext->func->getResults() == target->getResults();
    if (target->getResults() == type || isReturn) {
      break;
    }
    i++;
  }
  std::vector<Expression*> args;
  for (const auto& type : target->getParams()) {
    args.push_back(make(type));
  }
  // TODO: half the time make a completely random item with that type.
  return builder.makeCallRef(
    builder.makeRefFunc(target->name, target->type), args, type, isReturn);
}